

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O0

void ArrayAllocation(bool *result)

{
  long lVar1;
  void *pointer;
  long *pointer_00;
  TestClass2 *pTVar2;
  TestClass2 *this;
  TestClass2 *local_48;
  TestClass2 *arr2;
  TestClass1 *arr1;
  uint64_t memLeakSize;
  size_t memLeakCount;
  bool *result_local;
  
  memLeakCount = (size_t)result;
  MemPlumber::start(false,"",false);
  pointer = operator_new__(400);
  MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&arr1,false,"",false);
  if (memLeakSize == 1) {
    if (arr1 == (TestClass1 *)0x190) {
      pointer_00 = (long *)operator_new__(0x5a8);
      *pointer_00 = 0x1e;
      pTVar2 = (TestClass2 *)(pointer_00 + 1);
      local_48 = pTVar2;
      do {
        TestClass2::TestClass2(local_48);
        local_48 = local_48 + 1;
      } while (local_48 != (TestClass2 *)(pointer_00 + 0xb5));
      MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&arr1,false,"",false);
      if (memLeakSize == 0x20) {
        if (arr1 == (TestClass1 *)0x828) {
          if (pTVar2 != (TestClass2 *)0x0) {
            lVar1 = *pointer_00;
            this = pTVar2 + lVar1;
            while (pTVar2 != this) {
              this = this + -1;
              TestClass2::~TestClass2(this);
            }
            operator_delete__(pointer_00,lVar1 * 0x30 + 8);
          }
          MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&arr1,false,"",false);
          if (memLeakSize == 1) {
            if (arr1 == (TestClass1 *)0x190) {
              if (pointer != (void *)0x0) {
                operator_delete__(pointer);
              }
              MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&arr1,false,"",false);
              if (memLeakSize == 0) {
                if (arr1 == (TestClass1 *)0x0) {
                  MemPlumber::stopAndFreeAllMemory();
                }
                else {
                  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                         "ArrayAllocation",0x76,(ulong)arr1 & 0xffffffff,0);
                  *(undefined1 *)memLeakCount = 0;
                }
              }
              else {
                printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                       "ArrayAllocation",0x76,memLeakSize & 0xffffffff,0);
                *(undefined1 *)memLeakCount = 0;
              }
            }
            else {
              printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                     "ArrayAllocation",0x72,(ulong)arr1 & 0xffffffff,400);
              *(undefined1 *)memLeakCount = 0;
            }
          }
          else {
            printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                   "ArrayAllocation",0x72,memLeakSize & 0xffffffff,1);
            *(undefined1 *)memLeakCount = 0;
          }
        }
        else {
          printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                 "ArrayAllocation",0x6e,(ulong)arr1 & 0xffffffff,0x828);
          *(undefined1 *)memLeakCount = 0;
        }
      }
      else {
        printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","ArrayAllocation",
               0x6e,memLeakSize & 0xffffffff,0x20);
        *(undefined1 *)memLeakCount = 0;
      }
    }
    else {
      printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","ArrayAllocation",
             0x6a,(ulong)arr1 & 0xffffffff,400);
      *(undefined1 *)memLeakCount = 0;
    }
  }
  else {
    printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","ArrayAllocation",0x6a
           ,memLeakSize & 0xffffffff,1);
    *(undefined1 *)memLeakCount = 0;
  }
  return;
}

Assistant:

TEST_CASE(ArrayAllocation) {

    START_TEST;

    TestClass1* arr1 = new TestClass1[100];

    CHECK_MEM_LEAK(1, 100*sizeof(TestClass1));

    TestClass2* arr2 = new TestClass2[30];

    CHECK_MEM_LEAK(2+30, 100*sizeof(TestClass1) + 30*sizeof(TestClass2) + 30*sizeof(double) + sizeof(void*));

    delete [] arr2;

    CHECK_MEM_LEAK(1, 100*sizeof(TestClass1));

    delete [] arr1;

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}